

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

void __thiscall
ktx::CommandCreate::determineTargetOrigin
          (CommandCreate *this,ImageInput *in,ImageSpec *target,Origin *usedSourceOrigin)

{
  bool bVar1;
  Origin *pOVar2;
  CommandCreate *in_RCX;
  ImageSpec *in_RDX;
  long *in_RSI;
  ImageInput *in_RDI;
  char **in_stack_00000038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000040;
  char (*in_stack_00000048) [128];
  ReturnCode in_stack_00000054;
  Reporter *in_stack_00000058;
  Origin *in_stack_ffffffffffffffd0;
  
  determineSourceOrigin(in_RCX,in_RDI,in_stack_ffffffffffffffd0);
  ImageSpec::setOrigin(in_RDX,(Origin *)in_RCX);
  bVar1 = std::optional<ImageSpec::Origin>::has_value((optional<ImageSpec::Origin> *)0x1e2035);
  if (bVar1) {
    bVar1 = ImageSpec::Origin::unspecified((Origin *)in_RCX);
    if (bVar1) {
      (**(code **)(*in_RSI + 0x68))();
      Reporter::fatal<char_const(&)[128],std::__cxx11::string_const&,char_const*&>
                (in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000040,
                 in_stack_00000038);
    }
    else {
      pOVar2 = std::optional<ImageSpec::Origin>::value
                         ((optional<ImageSpec::Origin> *)in_stack_ffffffffffffffd0);
      bVar1 = ::operator!=(pOVar2,(Origin *)in_RCX);
      if (bVar1) {
        pOVar2 = std::optional<ImageSpec::Origin>::value
                           ((optional<ImageSpec::Origin> *)in_stack_ffffffffffffffd0);
        ImageSpec::setOrigin(in_RDX,pOVar2);
      }
    }
  }
  return;
}

Assistant:

void CommandCreate::determineTargetOrigin(const ImageInput& in, ImageSpec& target,
                                          ImageSpec::Origin& usedSourceOrigin) {
    determineSourceOrigin(in, usedSourceOrigin);
    target.setOrigin(usedSourceOrigin);

    if (options.convertTexcoordOrigin.has_value()) {
        if (usedSourceOrigin.unspecified()) {
            fatal(rc::INVALID_FILE, "Cannot convert texcoord origin as no information about the origin "
                "is available in the input file \"{}\". Use --{} to specify one.",
                in.filename(), OptionsCreate::kAssignTexcoordOrigin);
        } else if (options.convertTexcoordOrigin.value() != usedSourceOrigin) {
            target.setOrigin(options.convertTexcoordOrigin.value());
        }
    }
}